

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::Engine(Engine *this)

{
  IntVar **ppIVar1;
  duration<long,_std::ratio<1L,_1000L>_> dVar2;
  void *pvVar3;
  MIP *pMVar4;
  vec<IntVar_*> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  function<void_(Problem_*)> *in_stack_ffffffffffffff70;
  IntVar ***this_00;
  BranchGroup *this_01;
  MIP *this_02;
  int local_18;
  
  vec<IntVar_*>::vec(in_RDI);
  vec<Branching_*>::vec((vec<Branching_*> *)(in_RDI + 1));
  vec<Propagator_*>::vec((vec<Propagator_*> *)(in_RDI + 2));
  this_02 = (MIP *)(in_RDI + 3);
  vec<PseudoProp_*>::vec((vec<PseudoProp_*> *)this_02);
  vec<Checker_*>::vec((vec<Checker_*> *)(in_RDI + 4));
  vec<int>::vec((vec<int> *)(in_RDI + 5));
  *(undefined1 *)&in_RDI[6].sz = 0;
  in_RDI[6].data = (IntVar **)0x0;
  in_RDI[7].data = (IntVar **)0x0;
  in_RDI[8].cap = 0xffffffff;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff70);
  vec<IntVar_*>::vec((vec<IntVar_*> *)&in_RDI[9].data);
  vec<vec<Propagator_*>_>::vec((vec<vec<Propagator_*>_> *)&in_RDI[10].data);
  in_RDI[0xb].data = (IntVar **)0x0;
  vec<DecInfo>::vec((vec<DecInfo> *)&in_RDI[0xc].data);
  this_01 = (BranchGroup *)&in_RDI[0xd].data;
  vec<TrailElem>::vec((vec<TrailElem> *)this_01);
  this_00 = &in_RDI[0xe].data;
  vec<int>::vec((vec<int> *)this_00);
  ppIVar1 = (IntVar **)std::chrono::_V2::steady_clock::now();
  in_RDI[0xf].data = ppIVar1;
  dVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::zero();
  in_RDI[0x10].data = (IntVar **)dVar2.__r;
  in_RDI[0x11].data = (IntVar **)0x0;
  in_RDI[0x12].sz = 1;
  in_RDI[0x12].cap = 0;
  in_RDI[0x12].data = (IntVar **)0x0;
  in_RDI[0x13].sz = 0;
  in_RDI[0x13].cap = 0;
  in_RDI[0x13].data = (IntVar **)0x0;
  in_RDI[0x14].data = (IntVar **)&std::cout;
  std::function<void_(Problem_*)>::function
            (in_stack_ffffffffffffff70,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x280696);
  vec<vec<Propagator_*>_>::growTo
            ((vec<vec<Propagator_*>_> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
    bit[local_18] = 1L << ((byte)local_18 & 0x3f);
  }
  pvVar3 = operator_new(0x38);
  BranchGroup::BranchGroup
            (this_01,(VarBranch)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
  *(void **)(in_RDI + 7) = pvVar3;
  pMVar4 = (MIP *)operator_new(0x118);
  MIP::MIP(this_02);
  mip = pMVar4;
  return;
}

Assistant:

Engine::Engine()
		: start_time(chuffed_clock::now()),
			opt_time(duration::zero()),

			output_stream(&std::cout),
			solution_callback(nullptr)
#ifdef HAS_VAR_IMPACT
			,
			last_int(nullptr)
#endif
{
	p_queue.growTo(num_queues);
	for (int i = 0; i < 64; i++) {
		bit[i] = ((long long)1 << i);
	}
	branching = new BranchGroup();
	mip = new MIP();
}